

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock-test.c
# Opt level: O0

void * stress_reader(void *arg)

{
  int iVar1;
  int local_34;
  int local_30;
  int i_1;
  int i;
  uint seed;
  timespec now;
  stress_data *stress_data;
  void *arg_local;
  
  now.tv_nsec = (__syscall_slong_t)arg;
  iVar1 = clock_gettime(1,(timespec *)&i);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/rwlock-test.c"
               ,0x16,"clock_gettime(CLOCK_MONOTONIC, &now) == 0");
  }
  i_1 = (int)now.tv_sec;
  for (local_30 = 0; local_30 < *(int *)now.tv_nsec; local_30 = local_30 + 1) {
    iVar1 = rand_r((uint *)&i_1);
    usleep((iVar1 % 8 + 1) * 10);
    rwlock_lock_read(*(RWLock **)(now.tv_nsec + 8));
    for (local_34 = 1; local_34 < 1000; local_34 = local_34 + 1) {
      if (*(int *)(*(long *)(now.tv_nsec + 0x10) + (long)local_34 * 4) !=
          *(int *)(*(long *)(now.tv_nsec + 0x10) + (long)(local_34 + -1) * 4) + 1) {
        microatf_fail_require
                  ("%s:%d: %s not met",
                   "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/rwlock-test.c"
                   ,0x1f,"stress_data->data[i] == stress_data->data[i - 1] + 1");
      }
    }
    rwlock_unlock_read(*(RWLock **)(now.tv_nsec + 8));
  }
  return (void *)0x0;
}

Assistant:

static void *
stress_reader(void *arg)
{
	struct stress_data *stress_data = arg;
	struct timespec now;
	ATF_REQUIRE(clock_gettime(CLOCK_MONOTONIC, &now) == 0);
	unsigned int seed = (unsigned int)now.tv_nsec;

	for (int i = 0; i < stress_data->iterations; ++i) {
		usleep((useconds_t)(((rand_r(&seed) % 8) + 1) * 10));

		rwlock_lock_read(stress_data->lock);
		for (int i = 1; i < 1000; ++i) {
			ATF_REQUIRE(stress_data->data[i] ==
			    stress_data->data[i - 1] + 1);
		}
		rwlock_unlock_read(stress_data->lock);
	}

	return NULL;
}